

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  char *__s;
  ProcessContext *pPVar1;
  long lVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  anon_class_24_3_9ec25511 *func_00;
  anon_class_24_3_9ec25511 *extraout_RDX;
  anon_class_24_3_9ec25511 *extraout_RDX_00;
  long lVar4;
  char *pcVar5;
  StringPtr *ptrCopy;
  Exception *pEVar6;
  ArrayPtr<kj::StringPtr> params;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  StringPtr params_stack [8];
  int local_42c;
  char **local_428;
  ProcessContext *local_420;
  Exception *local_418;
  Exception *local_410;
  Exception *local_408;
  MainFunc *local_400;
  char ***local_3f8;
  Exception **local_3f0;
  Maybe<kj::Exception> local_3e8;
  undefined1 local_250 [8];
  undefined1 local_248 [24];
  char *local_230;
  int iStack_228;
  Type TStack_224;
  char *local_220;
  size_t sStack_218;
  ArrayDisposer *local_210;
  Disposer *pDStack_208;
  Context *local_200;
  char *pcStack_1f8;
  size_t local_1f0;
  ArrayDisposer *local_1e8;
  undefined1 local_1e0 [264];
  Detail *local_d8;
  RemoveConst<kj::Exception::Detail> *pRStack_d0;
  Detail *local_c8;
  ArrayDisposer *pAStack_c0;
  
  func_00 = (anon_class_24_3_9ec25511 *)CONCAT44(in_register_00000014,argc);
  local_250 = (undefined1  [8])&local_42c;
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  local_248._8_8_ = " > ";
  local_248._16_8_ = &DAT_00000004;
  local_230 = (char *)CONCAT71(local_230._1_7_,0 < argc);
  local_42c = argc;
  local_428 = argv;
  if (0 < argc) {
    local_408 = (Exception *)(long)(argc + -1);
    lVar2 = 0;
    pcVar5 = "";
    do {
      *(char **)(&stack0xffffffffffffff48 + lVar2) = "";
      *(undefined8 *)(&stack0xffffffffffffff50 + lVar2) = 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x80);
    pEVar6 = (Exception *)0x0;
    local_418 = (Exception *)0x0;
    if (9 < (uint)argc) {
      pEVar6 = (Exception *)
               _::HeapArrayDisposer::allocateImpl
                         (0x10,(size_t)local_408,(size_t)local_408,
                          _::HeapArrayDisposer::Allocate_<kj::StringPtr>::construct,
                          ArrayDisposer::Dispose_<kj::StringPtr>::destruct);
      local_418 = local_408;
      func_00 = extraout_RDX;
    }
    local_410 = (Exception *)&stack0xffffffffffffff48;
    if (9 < (uint)argc) {
      local_408 = local_418;
      local_410 = pEVar6;
    }
    lVar2 = (long)local_42c;
    pEVar6 = local_418;
    local_420 = context;
    if (1 < lVar2) {
      lVar4 = 0;
      do {
        __s = *(char **)((long)local_428 + lVar4 + 8);
        sVar3 = strlen(__s);
        *(char **)((long)local_410->trace + lVar4 * 2 + -0x68) = __s;
        *(size_t *)((long)local_410->trace + lVar4 * 2 + -0x60) = sVar3 + 1;
        lVar4 = lVar4 + 8;
        pEVar6 = local_410;
        func_00 = extraout_RDX_00;
      } while (lVar2 * 8 + -8 != lVar4);
    }
    local_3f8 = &local_428;
    local_3f0 = &local_410;
    local_400 = func;
    runCatchingExceptions<kj::runMainAndExit(kj::ProcessContext&,kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>&&,int,char**)::__0>
              (&local_3e8,(kj *)&local_400,func_00);
    local_250[0] = local_3e8.ptr.isSet;
    if (local_3e8.ptr.isSet == true) {
      local_248._0_8_ = local_3e8.ptr.field_1.value.ownFile.content.ptr;
      local_248._8_8_ = local_3e8.ptr.field_1.value.ownFile.content.size_;
      local_248._16_8_ = local_3e8.ptr.field_1.value.ownFile.content.disposer;
      local_3e8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_3e8.ptr.field_1.value.ownFile.content.size_ = 0;
      local_230 = local_3e8.ptr.field_1.value.file;
      iStack_228 = local_3e8.ptr.field_1.value.line;
      TStack_224 = local_3e8.ptr.field_1.value.type;
      local_220 = local_3e8.ptr.field_1.value.description.content.ptr;
      sStack_218 = local_3e8.ptr.field_1.value.description.content.size_;
      local_210 = local_3e8.ptr.field_1.value.description.content.disposer;
      pDStack_208 = local_3e8.ptr.field_1.value.context.ptr.disposer;
      local_3e8.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_3e8.ptr.field_1.value.description.content.size_ = 0;
      local_200 = local_3e8.ptr.field_1.value.context.ptr.ptr;
      pcStack_1f8 = local_3e8.ptr.field_1.value.remoteTrace.content.ptr;
      local_3e8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      local_1f0 = local_3e8.ptr.field_1.value.remoteTrace.content.size_;
      local_1e8 = local_3e8.ptr.field_1.value.remoteTrace.content.disposer;
      local_3e8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
      local_3e8.ptr.field_1.value.remoteTrace.content.size_ = 0;
      memcpy(local_1e0,(void *)((long)&local_3e8.ptr.field_1 + 0x68),0x105);
      local_d8 = local_3e8.ptr.field_1.value.details.builder.ptr;
      pRStack_d0 = local_3e8.ptr.field_1.value.details.builder.pos;
      local_c8 = local_3e8.ptr.field_1.value.details.builder.endPtr;
      pAStack_c0 = local_3e8.ptr.field_1.value.details.builder.disposer;
      local_3e8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
      local_3e8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      local_3e8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
      Exception::~Exception(&local_3e8.ptr.field_1.value);
    }
    pPVar1 = local_420;
    if (local_250[0] == '\x01') {
      str<char_const(&)[28],kj::Exception&>
                ((String *)&local_3e8,(kj *)"*** Uncaught exception ***\n",(char (*) [28])local_248,
                 pEVar6);
      if (local_3e8.ptr.field_1.value.ownFile.content.ptr != (char *)0x0) {
        pcVar5 = (char *)CONCAT71(local_3e8.ptr._1_7_,local_3e8.ptr.isSet);
      }
      (*pPVar1->_vptr_ProcessContext[3])
                (pPVar1,pcVar5,
                 local_3e8.ptr.field_1.value.ownFile.content.ptr +
                 (local_3e8.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
      String::~String((String *)&local_3e8);
    }
    if (local_250[0] == '\x01') {
      Exception::~Exception((Exception *)local_248);
    }
    (*pPVar1->_vptr_ProcessContext[1])(pPVar1);
  }
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
            ((Fault *)&local_3e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0xd4,FAILED,"argc > 0","_kjCondition,",(DebugComparison<int_&,_int> *)local_250);
  _::Debug::Fault::fatal((Fault *)&local_3e8);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

  try {
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_SOME(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", exception));
    }
    context.exit();
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}